

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O0

void d_version(char *v)

{
  int iVar1;
  size_t sVar2;
  char local_48 [8];
  char scommit [43];
  char *v_local;
  
  iVar1 = sprintf(v,"%d.%d",1,0x1e);
  sVar2 = strlen(git_commit_id);
  if (4 < sVar2) {
    strcpy(local_48,git_commit_id + 5);
    scommit[0x20] = '\0';
    sprintf(v + iVar1,".%s",local_48);
  }
  return;
}

Assistant:

void d_version(char *v) {
  v += sprintf(v, "%d.%d", D_MAJOR_VERSION, D_MINOR_VERSION);
  if (strlen(git_commit_id) > 4) {
    char scommit[43];
    strcpy(scommit, &git_commit_id[5]);
    scommit[40] = 0;
    v += sprintf(v, ".%s", scommit);
  }
}